

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O3

SUNErrCode SUNLinSolInitialize_PCG(SUNLinearSolver S)

{
  int *piVar1;
  
  piVar1 = (int *)S->content;
  if (*piVar1 < 1) {
    *piVar1 = 5;
  }
  if (2 < piVar1[1] - 1U) {
    piVar1[1] = 0;
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolInitialize_PCG(SUNLinearSolver S)
{
  SUNFunctionBegin(S->sunctx);
  if (PCG_CONTENT(S)->maxl <= 0) { PCG_CONTENT(S)->maxl = SUNPCG_MAXL_DEFAULT; }

  SUNAssert(PCG_CONTENT(S)->ATimes, SUN_ERR_ARG_CORRUPT);

  if ((PRETYPE(S) != SUN_PREC_LEFT) && (PRETYPE(S) != SUN_PREC_RIGHT) &&
      (PRETYPE(S) != SUN_PREC_BOTH))
  {
    PRETYPE(S) = SUN_PREC_NONE;
  }

  SUNAssert((PCG_CONTENT(S)->pretype == SUN_PREC_NONE) ||
              (PCG_CONTENT(S)->Psolve != NULL),
            SUN_ERR_ARG_CORRUPT);

  /* no additional memory to allocate */

  return SUN_SUCCESS;
}